

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

socket_handle FIX::socket_createAcceptor(int port,bool reuse)

{
  int __fd;
  int iVar1;
  sockaddr_in address;
  sockaddr local_2c;
  undefined4 local_1c;
  
  __fd = ::socket(2,1,0);
  if (__fd != -1) {
    local_2c.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
    local_2c.sa_family = 2;
    local_2c.sa_data[2] = '\0';
    local_2c.sa_data[3] = '\0';
    local_2c.sa_data[4] = '\0';
    local_2c.sa_data[5] = '\0';
    if (reuse) {
      local_1c = 1;
      setsockopt(__fd,1,2,&local_1c,4);
    }
    iVar1 = bind(__fd,&local_2c,0x10);
    if (iVar1 != -1) {
      iVar1 = listen(__fd,0x1000);
      if (iVar1 != -1) {
        return __fd;
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

socket_handle socket_createAcceptor(int port, bool reuse) {
  socket_handle socket = ::socket(PF_INET, SOCK_STREAM, 0);
  if (socket == INVALID_SOCKET_HANDLE) {
    return INVALID_SOCKET_HANDLE;
  }

  sockaddr_in address;
  socklen_t socklen;

  address.sin_family = PF_INET;
  address.sin_port = htons(port);
  address.sin_addr.s_addr = INADDR_ANY;
  socklen = sizeof(address);
  if (reuse) {
    socket_setsockopt(socket, SO_REUSEADDR);
  }

  int result = bind(socket, reinterpret_cast<sockaddr *>(&address), socklen);

  if (result == BIND_SOCKET_ERROR) {
    return INVALID_SOCKET_HANDLE;
  }
  result = listen(socket, SOMAXCONN);
  if (result == LISTEN_SOCKET_ERROR) {
    return INVALID_SOCKET_HANDLE;
  }
  return socket;
}